

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O1

void bn_mul_normal(unsigned_long *r,unsigned_long *a,int na,unsigned_long *b,int nb)

{
  bool bVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  puVar2 = b;
  iVar6 = nb;
  if (na < nb) {
    puVar2 = a;
    a = b;
    iVar6 = na;
    na = nb;
  }
  if (iVar6 < 1) {
    bn_mul_words(r,a,na,0);
    return;
  }
  lVar5 = (long)na;
  uVar3 = bn_mul_words(r,a,na,*puVar2);
  r[lVar5] = uVar3;
  if (iVar6 != 1) {
    lVar4 = 0;
    do {
      uVar3 = bn_mul_add_words((ulong *)((long)r + lVar4 + 8),a,na,
                               *(ulong *)((long)puVar2 + lVar4 + 8));
      *(ulong *)((long)r + lVar4 + lVar5 * 8 + 8) = uVar3;
      if (iVar6 == 2) {
        return;
      }
      uVar3 = bn_mul_add_words((ulong *)((long)r + lVar4 + 0x10),a,na,
                               *(ulong *)((long)puVar2 + lVar4 + 0x10));
      *(ulong *)((long)r + lVar4 + lVar5 * 8 + 0x10) = uVar3;
      if (iVar6 < 4) {
        return;
      }
      uVar3 = bn_mul_add_words((ulong *)((long)r + lVar4 + 0x18),a,na,
                               *(ulong *)((long)puVar2 + lVar4 + 0x18));
      *(ulong *)((long)r + lVar4 + lVar5 * 8 + 0x18) = uVar3;
      if (iVar6 == 4) {
        return;
      }
      uVar3 = bn_mul_add_words((ulong *)((long)r + lVar4 + 0x20),a,na,
                               *(ulong *)((long)puVar2 + lVar4 + 0x20));
      *(ulong *)((long)r + lVar4 + lVar5 * 8 + 0x20) = uVar3;
      lVar4 = lVar4 + 0x20;
      bVar1 = 5 < iVar6;
      iVar6 = iVar6 + -4;
    } while (bVar1);
  }
  return;
}

Assistant:

void bn_mul_normal(BN_ULONG *r, BN_ULONG *a, int na, BN_ULONG *b, int nb)
{
    BN_ULONG *rr;

    if (na < nb) {
        int itmp;
        BN_ULONG *ltmp;

        itmp = na;
        na = nb;
        nb = itmp;
        ltmp = a;
        a = b;
        b = ltmp;

    }
    rr = &(r[na]);
    if (nb <= 0) {
        (void)bn_mul_words(r, a, na, 0);
        return;
    } else
        rr[0] = bn_mul_words(r, a, na, b[0]);

    for (;;) {
        if (--nb <= 0)
            return;
        rr[1] = bn_mul_add_words(&(r[1]), a, na, b[1]);
        if (--nb <= 0)
            return;
        rr[2] = bn_mul_add_words(&(r[2]), a, na, b[2]);
        if (--nb <= 0)
            return;
        rr[3] = bn_mul_add_words(&(r[3]), a, na, b[3]);
        if (--nb <= 0)
            return;
        rr[4] = bn_mul_add_words(&(r[4]), a, na, b[4]);
        rr += 4;
        r += 4;
        b += 4;
    }
}